

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemView::dataChanged
          (QAbstractItemView *this,QModelIndex *topLeft,QModelIndex *bottomRight,QList<int> *roles)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemViewPrivate *this_00;
  QEditorInfo *pQVar5;
  long *plVar6;
  QWidget *pQVar7;
  QDebug *pQVar8;
  long lVar9;
  ulong uVar10;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QRect QVar11;
  QAbstractItemDelegate *delegate;
  QEditorInfo *editorInfo;
  QAbstractItemViewPrivate *d;
  QRect updateRect;
  QAccessibleTableModelChangeEvent accessibleEvent;
  QWidget *in_stack_fffffffffffffeb8;
  QAbstractItemViewPrivate *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QModelIndex *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffef8 [16];
  QAbstractItemViewPrivate *in_stack_ffffffffffffff08;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70 [7];
  QAccessibleTableModelChangeEvent local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractItemView *)0x80d485);
  bVar1 = ::operator==((QModelIndex *)in_stack_fffffffffffffec0,
                       (QModelIndex *)in_stack_fffffffffffffeb8);
  if ((bVar1) && (bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffec0), bVar1)) {
    pQVar5 = QAbstractItemViewPrivate::editorForIndex
                       ((QAbstractItemViewPrivate *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        in_stack_fffffffffffffed0);
    if (((pQVar5->isStatic & 1U) == 0) &&
       ((bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x80d4ed), bVar1 &&
        (plVar6 = (long *)(**(code **)(*in_RDI + 0x208))(in_RDI,in_RSI), plVar6 != (long *)0x0)))) {
      pQVar7 = QPointer<QWidget>::data((QPointer<QWidget> *)0x80d527);
      (**(code **)(*plVar6 + 0x80))(plVar6,pQVar7,in_RSI);
    }
    bVar1 = QWidget::isVisible((QWidget *)0x80d549);
    if ((bVar1) && ((this_00->delayedPendingLayout & 1U) == 0)) {
      update((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (QModelIndex *)in_stack_fffffffffffffec0);
    }
  }
  else {
    QAbstractItemViewPrivate::updateEditorData
              (in_stack_ffffffffffffff08,in_stack_fffffffffffffef8._8_8_,
               in_stack_fffffffffffffef8._0_8_);
    bVar1 = QWidget::isVisible((QWidget *)0x80d58f);
    if ((bVar1) && ((this_00->delayedPendingLayout & 1U) == 0)) {
      bVar2 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffec0);
      bVar1 = true;
      if (bVar2) {
        QModelIndex::parent(in_stack_fffffffffffffed0);
        QModelIndex::parent(in_stack_fffffffffffffed0);
        bVar2 = ::operator!=((QModelIndex *)in_stack_fffffffffffffec0,
                             (QModelIndex *)in_stack_fffffffffffffeb8);
        bVar1 = true;
        if (!bVar2) {
          iVar4 = QModelIndex::row(in_RSI);
          iVar3 = QModelIndex::row(in_RDX);
          bVar1 = true;
          if (iVar4 <= iVar3) {
            in_stack_fffffffffffffedc = QModelIndex::column(in_RSI);
            iVar4 = QModelIndex::column(in_RDX);
            bVar1 = iVar4 < in_stack_fffffffffffffedc;
          }
        }
      }
      if (bVar1) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffed0,
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(char *)in_stack_fffffffffffffeb8
                  );
        QMessageLogger::warning();
        QDebug::nospace(&local_90);
        QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                           (char *)in_stack_ffffffffffffff08);
        pQVar8 = QDebug::operator<<((QDebug *)
                                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                    (char *)in_stack_ffffffffffffff08);
        QDebug::QDebug(&local_88,pQVar8);
        ::operator<<((QDebug *)&local_80,(QModelIndex *)&local_88);
        pQVar8 = QDebug::operator<<((QDebug *)
                                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                    (char *)in_stack_ffffffffffffff08);
        QDebug::QDebug(&local_78,pQVar8);
        ::operator<<((QDebug *)local_70,(QModelIndex *)&local_78);
        QDebug::~QDebug(local_70);
        QDebug::~QDebug(&local_78);
        QDebug::~QDebug(&local_80);
        QDebug::~QDebug(&local_88);
        QDebug::~QDebug(&local_90);
        QWidget::update(in_stack_fffffffffffffeb8);
      }
      else {
        in_stack_fffffffffffffec8 = QModelIndex::row(in_RDX);
        iVar4 = QModelIndex::row(in_RSI);
        in_stack_fffffffffffffed0 = (QModelIndex *)((long)(in_stack_fffffffffffffec8 - iVar4) + 1);
        in_stack_fffffffffffffecc = QModelIndex::column(in_RDX);
        iVar4 = QModelIndex::column(in_RSI);
        lVar9 = (long)in_stack_fffffffffffffed0 * ((long)(in_stack_fffffffffffffecc - iVar4) + 1);
        if (lVar9 - this_00->updateThreshold == 0 || lVar9 < this_00->updateThreshold) {
          QVar11 = QWidget::rect((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate + 0x108))
                    (this_00,QVar11._0_8_,QVar11._8_8_,in_RSI,in_RDX);
          bVar1 = QRect::isEmpty((QRect *)this_00);
          in_stack_fffffffffffffec0 = this_00;
          if (!bVar1) {
            QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                            ,(QRect *)this_00);
            in_stack_fffffffffffffec0 = this_00;
          }
        }
        else {
          QWidget::update(in_stack_fffffffffffffeb8);
        }
      }
    }
  }
  uVar10 = QAccessible::isActive();
  if ((uVar10 & 1) != 0) {
    memset(local_38,0xaa,0x30);
    QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)in_stack_fffffffffffffed0,
               (QObject *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (ModelChangeType)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    iVar4 = QModelIndex::row(in_RSI);
    QAccessibleTableModelChangeEvent::setFirstRow(local_38,iVar4);
    iVar4 = QModelIndex::column(in_RSI);
    QAccessibleTableModelChangeEvent::setFirstColumn(local_38,iVar4);
    iVar4 = QModelIndex::row(in_RDX);
    QAccessibleTableModelChangeEvent::setLastRow(local_38,iVar4);
    iVar4 = QModelIndex::column(in_RDX);
    QAccessibleTableModelChangeEvent::setLastColumn(local_38,iVar4);
    QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_38);
  }
  QAbstractItemViewPrivate::updateGeometry(in_stack_fffffffffffffec0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight,
                                    const QList<int> &roles)
{
    Q_UNUSED(roles);
    // Single item changed
    Q_D(QAbstractItemView);
    if (topLeft == bottomRight && topLeft.isValid()) {
        const QEditorInfo &editorInfo = d->editorForIndex(topLeft);
        //we don't update the edit data if it is static
        if (!editorInfo.isStatic && editorInfo.widget) {
            QAbstractItemDelegate *delegate = itemDelegateForIndex(topLeft);
            if (delegate) {
                delegate->setEditorData(editorInfo.widget.data(), topLeft);
            }
        }
        if (isVisible() && !d->delayedPendingLayout) {
            // otherwise the items will be updated later anyway
            update(topLeft);
        }
    } else {
        d->updateEditorData(topLeft, bottomRight);
        if (isVisible() && !d->delayedPendingLayout) {
            if (!topLeft.isValid() ||
                topLeft.parent() != bottomRight.parent() ||
                topLeft.row() > bottomRight.row() ||
                topLeft.column() > bottomRight.column()) {
                // invalid parameter - call update() to redraw all
                qWarning().nospace() << "dataChanged() called with an invalid index range:"
                                     << "\n    topleft: " << topLeft
                                     << "\n    bottomRight:" << bottomRight;
                d->viewport->update();
            } else if ((bottomRight.row() - topLeft.row() + 1LL) *
                       (bottomRight.column() - topLeft.column() + 1LL) > d->updateThreshold) {
                // too many indices to check - force full update
                d->viewport->update();
            } else {
                const QRect updateRect = d->intersectedRect(d->viewport->rect(), topLeft, bottomRight);
                if (!updateRect.isEmpty())
                    d->viewport->update(updateRect);
            }
        }
    }

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::DataChanged);
        accessibleEvent.setFirstRow(topLeft.row());
        accessibleEvent.setFirstColumn(topLeft.column());
        accessibleEvent.setLastRow(bottomRight.row());
        accessibleEvent.setLastColumn(bottomRight.column());
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->updateGeometry();
}